

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_value.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::ListValueBind<false>
          (ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  undefined8 uVar4;
  pointer this;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  *in_RCX;
  ClientContext *in_RSI;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> in_RDI;
  LogicalType arg_type;
  idx_t i;
  LogicalType child_type;
  LogicalType *in_stack_fffffffffffffe78;
  LogicalType *pLVar5;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *in_stack_fffffffffffffe80;
  LogicalType *this_00;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  *in_stack_fffffffffffffe90;
  allocator *paVar6;
  undefined7 in_stack_fffffffffffffeb8;
  byte in_stack_fffffffffffffebf;
  LogicalType local_110 [24];
  LogicalType local_f8 [31];
  undefined1 local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  BinderException *in_stack_ffffffffffffff58;
  optional_idx in_stack_ffffffffffffff60;
  allocator local_91;
  string local_90 [32];
  idx_t local_70;
  Expression local_58 [24];
  ulong local_40;
  LogicalType local_38 [24];
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  *local_20;
  ClientContext *local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  bVar2 = std::
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ::empty(in_stack_fffffffffffffe90);
  if (bVar2) {
    duckdb::LogicalType::LogicalType(local_38,SQLNULL);
  }
  else {
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::operator[](in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_fffffffffffffe80);
    duckdb::ExpressionBinder::GetExpressionReturnType((Expression *)local_38);
  }
  local_40 = 1;
  while( true ) {
    uVar1 = local_40;
    sVar3 = std::
            vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ::size(local_20);
    if (sVar3 <= uVar1) {
      duckdb::LogicalType::NormalizeType(local_f8);
      pLVar5 = local_38;
      this_00 = local_f8;
      LogicalType::operator=(this_00,in_stack_fffffffffffffe78);
      duckdb::LogicalType::~LogicalType(this_00);
      LogicalType::operator=(pLVar5,this_00);
      duckdb::LogicalType::LIST(local_110);
      pLVar5 = local_110;
      LogicalType::operator=(this_00,pLVar5);
      duckdb::LogicalType::~LogicalType(pLVar5);
      make_uniq<duckdb::VariableReturnBindData,duckdb::LogicalType&>
                ((LogicalType *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
      unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
      unique_ptr<duckdb::VariableReturnBindData,std::default_delete<std::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>>>,void>
                ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                  *)this_00,
                 (unique_ptr<duckdb::VariableReturnBindData,_std::default_delete<duckdb::VariableReturnBindData>_>
                  *)pLVar5);
      unique_ptr<duckdb::VariableReturnBindData,_std::default_delete<duckdb::VariableReturnBindData>,_true>
      ::~unique_ptr((unique_ptr<duckdb::VariableReturnBindData,_std::default_delete<duckdb::VariableReturnBindData>,_true>
                     *)0xd4d064);
      duckdb::LogicalType::~LogicalType(local_38);
      return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             in_RDI._M_t.
             super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
             .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    }
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::operator[](in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_fffffffffffffe80);
    duckdb::ExpressionBinder::GetExpressionReturnType(local_58);
    in_stack_fffffffffffffebf =
         duckdb::LogicalType::TryGetMaxLogicalType
                   (local_10,local_38,(LogicalType *)local_58,local_38);
    if ((in_stack_fffffffffffffebf & 1) == 0) break;
    duckdb::LogicalType::~LogicalType((LogicalType *)local_58);
    local_40 = local_40 + 1;
  }
  local_d9 = 1;
  uVar4 = __cxa_allocate_exception(0x10);
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[](in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
  this = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                   ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *
                    )in_stack_fffffffffffffe80);
  local_70 = (idx_t)BaseExpression::GetQueryLocation((BaseExpression *)this);
  paVar6 = &local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_90,"Cannot create a list of types %s and %s - an explicit cast is required",
             paVar6);
  duckdb::LogicalType::ToString_abi_cxx11_();
  duckdb::LogicalType::ToString_abi_cxx11_();
  BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff60,in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  local_d9 = 0;
  __cxa_throw(uVar4,&BinderException::typeinfo,BinderException::~BinderException);
}

Assistant:

static unique_ptr<FunctionData> ListValueBind(ClientContext &context, ScalarFunction &bound_function,
                                              vector<unique_ptr<Expression>> &arguments) {
	// collect names and deconflict, construct return type
	LogicalType child_type =
	    arguments.empty() ? LogicalType::SQLNULL : ExpressionBinder::GetExpressionReturnType(*arguments[0]);
	for (idx_t i = 1; i < arguments.size(); i++) {
		auto arg_type = ExpressionBinder::GetExpressionReturnType(*arguments[i]);
		if (!LogicalType::TryGetMaxLogicalType(context, child_type, arg_type, child_type)) {
			if (IS_UNPIVOT) {
				string list_arguments = "Full list: ";
				idx_t error_index = list_arguments.size();
				for (idx_t k = 0; k < arguments.size(); k++) {
					if (k > 0) {
						list_arguments += ", ";
					}
					if (k == i) {
						error_index = list_arguments.size();
					}
					list_arguments += arguments[k]->ToString() + " " + arguments[k]->return_type.ToString();
				}
				auto error =
				    StringUtil::Format("Cannot unpivot columns of types %s and %s - an explicit cast is required",
				                       child_type.ToString(), arg_type.ToString());
				throw BinderException(arguments[i]->GetQueryLocation(),
				                      QueryErrorContext::Format(list_arguments, error, error_index, false));
			} else {
				throw BinderException(arguments[i]->GetQueryLocation(),
				                      "Cannot create a list of types %s and %s - an explicit cast is required",
				                      child_type.ToString(), arg_type.ToString());
			}
		}
	}
	child_type = LogicalType::NormalizeType(child_type);

	// this is more for completeness reasons
	bound_function.varargs = child_type;
	bound_function.return_type = LogicalType::LIST(child_type);
	return make_uniq<VariableReturnBindData>(bound_function.return_type);
}